

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
node::BlockManager::FindUndoPos
          (BlockManager *this,BlockValidationState *state,int nFile,FlatFilePos *pos,uint nAddSize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  pointer pCVar4;
  Notifications *notifications;
  bool bVar5;
  size_t sVar6;
  long in_FS_OFFSET;
  bool out_of_space;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  bool local_95;
  int local_94;
  char *local_90;
  unique_lock<std::recursive_mutex> local_88;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pos->nFile = nFile;
  local_88._M_owns = false;
  local_94 = nFile;
  local_88._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_88);
  pCVar4 = (this->m_blockfile_info).
           super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = pCVar4[nFile].nUndoSize;
  pos->nPos = uVar3;
  pCVar4[nFile].nUndoSize = uVar3 + nAddSize;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->m_dirty_fileinfo,&local_94);
  sVar6 = FlatFileSeq::Allocate(&this->m_undo_file_seq,pos,(ulong)nAddSize,&local_95);
  if (local_95 == true) {
    notifications = (this->m_opts).notifications;
    paVar1 = &local_78.original.field_2;
    local_78.original._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Disk space is too low!","")
    ;
    paVar2 = &local_78.translated.field_2;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_78.translated._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78.translated,"Disk space is too low!","");
    }
    else {
      local_90 = "Disk space is too low!";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_78.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_90);
    }
    bVar5 = FatalError(notifications,state,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.translated._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.translated._M_dataplus._M_p,
                      local_78.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar5 = true;
    if ((sVar6 != 0) && (this->m_prune_mode == true)) {
      this->m_check_for_pruning = true;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::FindUndoPos(BlockValidationState& state, int nFile, FlatFilePos& pos, unsigned int nAddSize)
{
    pos.nFile = nFile;

    LOCK(cs_LastBlockFile);

    pos.nPos = m_blockfile_info[nFile].nUndoSize;
    m_blockfile_info[nFile].nUndoSize += nAddSize;
    m_dirty_fileinfo.insert(nFile);

    bool out_of_space;
    size_t bytes_allocated = m_undo_file_seq.Allocate(pos, nAddSize, out_of_space);
    if (out_of_space) {
        return FatalError(m_opts.notifications, state, _("Disk space is too low!"));
    }
    if (bytes_allocated != 0 && IsPruneMode()) {
        m_check_for_pruning = true;
    }

    return true;
}